

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_switch::dump(statement_switch *this,ostream *o)

{
  bool bVar1;
  reference ppsVar2;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *in_RSI;
  long in_RDI;
  statement_base **ptr_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range2_1;
  statement_base **ptr;
  const_iterator __end2;
  const_iterator __begin2;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range2;
  value_type *it;
  const_iterator __end1;
  const_iterator __begin1;
  map_t<var,_statement_block_*> *__range1;
  _Self *in_stack_fffffffffffffec8;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *in_stack_fffffffffffffed0;
  ostream *in_stack_fffffffffffffee8;
  iterator in_stack_fffffffffffffef0;
  any *in_stack_fffffffffffffef8;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
  local_f0;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *local_d0;
  reference local_c8;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
  local_a0;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *local_80;
  string local_68 [32];
  reference local_48;
  iterator local_40;
  iterator local_30;
  long local_20;
  tree_node *local_18;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *local_10;
  
  local_10 = in_RSI;
  std::operator<<((ostream *)in_RSI,"< BeginSwitch: Condition = ");
  local_18 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffec8);
  compiler_type::dump_expr(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::operator<<((ostream *)local_10," >\n");
  local_20 = in_RDI + 0x30;
  local_30 = (iterator)
             phmap::priv::
             raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
             ::begin(in_stack_fffffffffffffed0);
  local_40 = (iterator)
             phmap::priv::
             raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
             ::end(in_stack_fffffffffffffed0);
  while( true ) {
    bVar1 = phmap::priv::operator!=
                      ((const_iterator *)in_stack_fffffffffffffed0,
                       (const_iterator *)in_stack_fffffffffffffec8);
    if (!bVar1) break;
    local_48 = phmap::priv::
               raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
               ::const_iterator::operator*((const_iterator *)0x5de60d);
    std::operator<<((ostream *)local_10,"< BeginCase: Tag = \"");
    in_stack_fffffffffffffed0 = local_10;
    cs_impl::any::to_string_abi_cxx11_(in_stack_fffffffffffffef8);
    std::operator<<((ostream *)in_stack_fffffffffffffed0,local_68);
    std::__cxx11::string::~string(local_68);
    std::operator<<((ostream *)local_10,"\" >\n");
    local_80 = statement_block::get_block(local_48->second);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffec8);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffec8);
    while( true ) {
      bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      if (!bVar1) break;
      local_c8 = std::
                 _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
                 ::operator*(&local_a0);
      (*(*local_c8)->_vptr_statement_base[5])(*local_c8,local_10);
      std::
      _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
      ::operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
                    *)in_stack_fffffffffffffed0);
    }
    std::operator<<((ostream *)local_10,"< EndCase >\n");
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
    ::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffed0);
  }
  if (*(long *)(in_RDI + 0x28) != 0) {
    std::operator<<((ostream *)local_10,"< BeginDefaultCase >\n");
    local_d0 = statement_block::get_block(*(statement_block **)(in_RDI + 0x28));
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffec8);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffec8);
    while( true ) {
      bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      if (!bVar1) break;
      ppsVar2 = std::
                _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
                ::operator*(&local_f0);
      (*(*ppsVar2)->_vptr_statement_base[5])(*ppsVar2,local_10);
      std::
      _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
      ::operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
                    *)in_stack_fffffffffffffed0);
    }
    std::operator<<((ostream *)local_10,"< EndDefaultCase >\n");
  }
  std::operator<<((ostream *)local_10,"< EndSwitch >\n");
  return;
}

Assistant:

void statement_switch::dump(std::ostream &o) const
	{
		o << "< BeginSwitch: Condition = ";
		compiler_type::dump_expr(mTree.root(), o);
		o << " >\n";
		for (auto &it: mCases) {
			o << "< BeginCase: Tag = \"";
			o << it.first.to_string();
			o << "\" >\n";
			for (auto &ptr: it.second->get_block())
				ptr->dump(o);
			o << "< EndCase >\n";
		}
		if (mDefault != nullptr) {
			o << "< BeginDefaultCase >\n";
			for (auto &ptr: mDefault->get_block())
				ptr->dump(o);
			o << "< EndDefaultCase >\n";
		}
		o << "< EndSwitch >\n";
	}